

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O0

sexp_conflict
sexp_remquo_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,
                sexp_conflict arg1)

{
  long lVar1;
  int *in_RCX;
  undefined8 in_RSI;
  long in_RDI;
  int *in_R8;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict res2;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  int tmp2;
  double *local_68;
  undefined8 local_60;
  double local_58;
  sexp_conflict *local_50;
  undefined8 local_48;
  sexp_conflict local_40;
  int local_34;
  int *local_30;
  int *local_28;
  undefined8 local_18;
  long local_10;
  sexp_conflict local_8;
  
  local_40 = (sexp_conflict)0x43e;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_50,0,0x10);
  local_58 = 5.36555291383594e-321;
  memset(&local_68,0,0x10);
  lVar1 = local_10;
  if ((((ulong)local_28 & 3) == 0) && (*local_28 == 0xb)) {
    if ((((ulong)local_30 & 3) == 0) && (*local_30 == 0xb)) {
      local_50 = &local_40;
      local_48 = *(undefined8 *)(local_10 + 0x6080);
      *(sexp_conflict ***)(local_10 + 0x6080) = &local_50;
      local_68 = &local_58;
      local_60 = *(undefined8 *)(local_10 + 0x6080);
      *(double ***)(local_10 + 0x6080) = &local_68;
      remquo(*(double *)(local_28 + 2),*(double *)(local_30 + 2),&local_34);
      local_40 = (sexp_conflict)sexp_make_flonum(lVar1);
      local_58 = (double)sexp_make_integer(local_10,(long)local_34,(long)local_34 >> 0x3f);
      local_40 = (sexp_conflict)sexp_cons_op(local_10,0,2,local_40,0x23e);
      sexp_push_op(local_10,&local_40,(local_40->value).flonum);
      (((local_40->value).type.cpl)->value).flonum = local_58;
      *(undefined8 *)(local_10 + 0x6080) = local_48;
      local_8 = local_40;
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,0xb,local_30);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,0xb,local_28);
  }
  return local_8;
}

Assistant:

sexp sexp_remquo_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  int tmp2;
  sexp_gc_var2(res, res2);
  if (! sexp_flonump(arg0))
    return sexp_type_exception(ctx, self, SEXP_FLONUM, arg0);
  if (! sexp_flonump(arg1))
    return sexp_type_exception(ctx, self, SEXP_FLONUM, arg1);
  sexp_gc_preserve2(ctx, res, res2);
  res = sexp_make_flonum(ctx, remquo(sexp_flonum_value(arg0), sexp_flonum_value(arg1), &tmp2));
  res2 = sexp_make_integer(ctx, tmp2);
  res = sexp_cons(ctx, res, SEXP_NULL);
  sexp_push(ctx, res, sexp_car(res));
  sexp_cadr(res) = res2;
  sexp_gc_release2(ctx);
  return res;
}